

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerTruncFloatToInt(I64ToI32Lowering *this,Unary *curr)

{
  BinaryOp BVar1;
  BinaryOp BVar2;
  UnaryOp op;
  Index IVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  LocalGet *pLVar8;
  Const *pCVar9;
  Binary *pBVar10;
  Unary *pUVar11;
  Const *right;
  pointer this_00;
  pointer this_01;
  LocalGet *value;
  Unary *ifFalse;
  If *pIVar12;
  LocalSet *any;
  LocalSet *append;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *puVar13;
  Block *result;
  uintptr_t local_258;
  If *local_250;
  If *highBitsVal;
  uintptr_t local_230;
  If *local_228;
  If *highBitsCalc;
  uintptr_t local_208;
  uintptr_t local_200;
  Unary *local_1f8;
  Expression *ltZeroBranch;
  Literal local_1d8;
  Literal local_1c0;
  uintptr_t local_1a8;
  Binary *local_1a0;
  Expression *gtZeroBranch;
  undefined1 local_190 [8];
  TempVar highBits;
  undefined1 local_168 [8];
  TempVar f;
  Literal local_140;
  Literal local_128;
  Literal local_110;
  Type local_f8;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  BinaryOp local_a4;
  BinaryOp local_a0;
  BinaryOp sub;
  BinaryOp div;
  BinaryOp min;
  BinaryOp gt;
  BinaryOp ge;
  Type localType;
  UnaryOp local_80;
  UnaryOp ceil;
  UnaryOp floor;
  UnaryOp abs;
  UnaryOp convert;
  UnaryOp trunc;
  Literal u32Max;
  undefined1 local_48 [8];
  Literal litOne;
  Literal litZero;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  wasm::Literal::Literal((Literal *)&litOne.type);
  wasm::Literal::Literal((Literal *)local_48);
  wasm::Literal::Literal((Literal *)&convert);
  wasm::Type::Type((Type *)&gt);
  switch(curr->op) {
  case TruncSFloat32ToInt64:
  case TruncUFloat32ToInt64:
    wasm::Literal::Literal(&local_c0,0.0);
    wasm::Literal::operator=((Literal *)&litOne.type,&local_c0);
    wasm::Literal::~Literal(&local_c0);
    wasm::Literal::Literal(&local_d8,1.0);
    wasm::Literal::operator=((Literal *)local_48,&local_d8);
    wasm::Literal::~Literal(&local_d8);
    wasm::Literal::Literal(&local_f0,4.2949673e+09);
    wasm::Literal::operator=((Literal *)&convert,&local_f0);
    wasm::Literal::~Literal(&local_f0);
    abs = TruncUFloat32ToInt32;
    floor = ConvertUInt32ToFloat32;
    wasm::Type::Type(&local_f8,f32);
    _gt = local_f8.id;
    ceil = AbsFloat32;
    min = GeFloat32;
    div = GtFloat32;
    sub = MinFloat32;
    local_80 = FloorFloat32;
    localType.id._4_4_ = CeilFloat32;
    local_a0 = DivFloat32;
    local_a4 = SubFloat32;
    break;
  default:
    abort();
  case TruncSFloat64ToInt64:
  case TruncUFloat64ToInt64:
    wasm::Literal::Literal(&local_110,0.0);
    wasm::Literal::operator=((Literal *)&litOne.type,&local_110);
    wasm::Literal::~Literal(&local_110);
    wasm::Literal::Literal(&local_128,1.0);
    wasm::Literal::operator=((Literal *)local_48,&local_128);
    wasm::Literal::~Literal(&local_128);
    wasm::Literal::Literal(&local_140,4294967296.0);
    wasm::Literal::operator=((Literal *)&convert,&local_140);
    wasm::Literal::~Literal(&local_140);
    abs = TruncUFloat64ToInt32;
    floor = ConvertUInt32ToFloat64;
    wasm::Type::Type(&f.ty,f64);
    _gt = f.ty.id;
    ceil = AbsFloat64;
    min = GeFloat64;
    div = GtFloat64;
    sub = MinFloat64;
    local_80 = FloorFloat64;
    localType.id._4_4_ = CeilFloat64;
    local_a0 = DivFloat64;
    local_a4 = SubFloat64;
  }
  highBits.ty.id = _gt;
  getTemp((TempVar *)local_168,this,_gt);
  wasm::Type::Type((Type *)&gtZeroBranch,i32);
  getTemp((TempVar *)local_190,this,(Type)gtZeroBranch);
  puVar13 = &this->builder;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar2 = sub;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar1 = local_a0;
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  local_1a8 = _gt;
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar3,_gt);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal(&local_1c0,(Literal *)&convert);
  pCVar9 = Builder::makeConst(pBVar7,&local_1c0);
  pBVar10 = Builder::makeBinary(pBVar6,BVar1,(Expression *)pLVar8,(Expression *)pCVar9);
  pUVar11 = Builder::makeUnary(pBVar5,local_80,(Expression *)pBVar10);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = local_a4;
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal(&local_1d8,(Literal *)&convert);
  pCVar9 = Builder::makeConst(pBVar6,&local_1d8);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal((Literal *)&ltZeroBranch,(Literal *)local_48);
  right = Builder::makeConst(pBVar6,(Literal *)&ltZeroBranch);
  pBVar10 = Builder::makeBinary(pBVar5,BVar1,(Expression *)pCVar9,(Expression *)right);
  pBVar10 = Builder::makeBinary(pBVar4,BVar2,(Expression *)pUVar11,(Expression *)pBVar10);
  wasm::Literal::~Literal((Literal *)&ltZeroBranch);
  wasm::Literal::~Literal(&local_1d8);
  wasm::Literal::~Literal(&local_1c0);
  puVar13 = &this->builder;
  local_1a0 = pBVar10;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  op = localType.id._4_4_;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar2 = local_a0;
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar1 = local_a4;
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  local_200 = _gt;
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar3,_gt);
  puVar13 = &this->builder;
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13)
  ;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13)
  ;
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  local_208 = _gt;
  value = Builder::makeLocalGet(this_01,IVar3,_gt);
  pUVar11 = Builder::makeUnary(this_00,abs,(Expression *)value);
  pUVar11 = Builder::makeUnary(pBVar7,floor,(Expression *)pUVar11);
  pBVar10 = Builder::makeBinary(pBVar6,BVar1,(Expression *)pLVar8,(Expression *)pUVar11);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal((Literal *)&highBitsCalc,(Literal *)&convert);
  pCVar9 = Builder::makeConst(pBVar6,(Literal *)&highBitsCalc);
  pBVar10 = Builder::makeBinary(pBVar5,BVar2,(Expression *)pBVar10,(Expression *)pCVar9);
  pUVar11 = Builder::makeUnary(pBVar4,op,(Expression *)pBVar10);
  wasm::Literal::~Literal((Literal *)&highBitsCalc);
  puVar13 = &this->builder;
  local_1f8 = pUVar11;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar1 = div;
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  local_230 = _gt;
  pLVar8 = Builder::makeLocalGet(pBVar6,IVar3,_gt);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal((Literal *)&highBitsVal,(Literal *)&litOne.type);
  pCVar9 = Builder::makeConst(pBVar6,(Literal *)&highBitsVal);
  pBVar10 = Builder::makeBinary(pBVar5,BVar1,(Expression *)pLVar8,(Expression *)pCVar9);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pUVar11 = Builder::makeUnary(pBVar5,abs,(Expression *)local_1a0);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  ifFalse = Builder::makeUnary(pBVar5,abs,(Expression *)local_1f8);
  pIVar12 = Builder::makeIf(pBVar4,(Expression *)pBVar10,(Expression *)pUVar11,(Expression *)ifFalse
                           );
  wasm::Literal::~Literal((Literal *)&highBitsVal);
  puVar13 = &this->builder;
  local_228 = pIVar12;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  BVar1 = min;
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  pBVar7 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(puVar13);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  local_258 = _gt;
  pLVar8 = Builder::makeLocalGet(pBVar7,IVar3,_gt);
  pUVar11 = Builder::makeUnary(pBVar6,ceil,(Expression *)pLVar8);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal((Literal *)&result,(Literal *)local_48);
  pCVar9 = Builder::makeConst(pBVar6,(Literal *)&result);
  pBVar10 = Builder::makeBinary(pBVar5,BVar1,(Expression *)pUVar11,(Expression *)pCVar9);
  pIVar12 = local_228;
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pCVar9 = Builder::makeConst<int>(pBVar5,0);
  pIVar12 = Builder::makeIf(pBVar4,(Expression *)pBVar10,(Expression *)pIVar12,(Expression *)pCVar9)
  ;
  wasm::Literal::~Literal((Literal *)&result);
  local_250 = pIVar12;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  any = Builder::makeLocalSet(pBVar5,IVar3,curr->value);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_190);
  append = Builder::makeLocalSet(pBVar5,IVar3,(Expression *)local_250);
  pBVar5 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar6 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_168);
  pLVar8 = Builder::makeLocalGet(pBVar6,IVar3,_gt);
  pUVar11 = Builder::makeUnary(pBVar5,abs,(Expression *)pLVar8);
  e = Builder::blockify<wasm::Unary*>(pBVar4,(Expression *)any,(Expression *)append,pUVar11);
  setOutParam(this,(Expression *)e,(TempVar *)local_190);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)e);
  TempVar::~TempVar((TempVar *)local_190);
  TempVar::~TempVar((TempVar *)local_168);
  wasm::Literal::~Literal((Literal *)&convert);
  wasm::Literal::~Literal((Literal *)local_48);
  wasm::Literal::~Literal((Literal *)&litOne.type);
  return;
}

Assistant:

void lowerTruncFloatToInt(Unary* curr) {
    // hiBits = if abs(f) >= 1.0 {
    //    if f > 0.0 {
    //        (unsigned) min(
    //          floor(f / (float) U32_MAX),
    //          (float) U32_MAX - 1,
    //        )
    //    } else {
    //        (unsigned) ceil((f - (float) (unsigned) f) / ((float) U32_MAX))
    //    }
    // } else {
    //    0
    // }
    //
    // loBits = (unsigned) f;

    Literal litZero, litOne, u32Max;
    UnaryOp trunc, convert, abs, floor, ceil;
    Type localType;
    BinaryOp ge, gt, min, div, sub;
    switch (curr->op) {
      case TruncSFloat32ToInt64:
      case TruncUFloat32ToInt64: {
        litZero = Literal((float)0);
        litOne = Literal((float)1);
        u32Max = Literal(((float)UINT_MAX) + 1);
        trunc = TruncUFloat32ToInt32;
        convert = ConvertUInt32ToFloat32;
        localType = Type::f32;
        abs = AbsFloat32;
        ge = GeFloat32;
        gt = GtFloat32;
        min = MinFloat32;
        floor = FloorFloat32;
        ceil = CeilFloat32;
        div = DivFloat32;
        sub = SubFloat32;
        break;
      }
      case TruncSFloat64ToInt64:
      case TruncUFloat64ToInt64: {
        litZero = Literal((double)0);
        litOne = Literal((double)1);
        u32Max = Literal(((double)UINT_MAX) + 1);
        trunc = TruncUFloat64ToInt32;
        convert = ConvertUInt32ToFloat64;
        localType = Type::f64;
        abs = AbsFloat64;
        ge = GeFloat64;
        gt = GtFloat64;
        min = MinFloat64;
        floor = FloorFloat64;
        ceil = CeilFloat64;
        div = DivFloat64;
        sub = SubFloat64;
        break;
      }
      default:
        abort();
    }

    TempVar f = getTemp(localType);
    TempVar highBits = getTemp();

    Expression* gtZeroBranch = builder->makeBinary(
      min,
      builder->makeUnary(
        floor,
        builder->makeBinary(div,
                            builder->makeLocalGet(f, localType),
                            builder->makeConst(u32Max))),
      builder->makeBinary(
        sub, builder->makeConst(u32Max), builder->makeConst(litOne)));
    Expression* ltZeroBranch = builder->makeUnary(
      ceil,
      builder->makeBinary(
        div,
        builder->makeBinary(
          sub,
          builder->makeLocalGet(f, localType),
          builder->makeUnary(
            convert,
            builder->makeUnary(trunc, builder->makeLocalGet(f, localType)))),
        builder->makeConst(u32Max)));

    If* highBitsCalc = builder->makeIf(
      builder->makeBinary(
        gt, builder->makeLocalGet(f, localType), builder->makeConst(litZero)),
      builder->makeUnary(trunc, gtZeroBranch),
      builder->makeUnary(trunc, ltZeroBranch));
    If* highBitsVal = builder->makeIf(
      builder->makeBinary(
        ge,
        builder->makeUnary(abs, builder->makeLocalGet(f, localType)),
        builder->makeConst(litOne)),
      highBitsCalc,
      builder->makeConst(int32_t(0)));
    Block* result = builder->blockify(
      builder->makeLocalSet(f, curr->value),
      builder->makeLocalSet(highBits, highBitsVal),
      builder->makeUnary(trunc, builder->makeLocalGet(f, localType)));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }